

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

void cppcms::util::urlencode_impl<std::ostreambuf_iterator<char,std::char_traits<char>>>
               (char *b,char *e,ostreambuf_iterator<char,_std::char_traits<char>_> out)

{
  int iVar1;
  ostreambuf_iterator<char,_std::char_traits<char>_> *poVar2;
  ostreambuf_iterator<char,_std::char_traits<char>_> *in_RSI;
  ostreambuf_iterator<char,_std::char_traits<char>_> *in_RDI;
  uchar uc;
  char c;
  char __c;
  ostreambuf_iterator<char,_std::char_traits<char>_> *local_18;
  ostreambuf_iterator<char,_std::char_traits<char>_> local_10;
  
  local_18 = in_RDI;
  while (local_18 != in_RSI) {
    poVar2 = (ostreambuf_iterator<char,_std::char_traits<char>_> *)((long)&local_18->_M_sbuf + 1);
    __c = *(char *)&local_18->_M_sbuf;
    local_18 = poVar2;
    if ((((__c < 'a') || ('z' < __c)) && ((__c < 'A' || ('Z' < __c)))) &&
       ((__c < '0' || ('9' < __c)))) {
      iVar1 = (int)__c;
      if (((iVar1 - 0x2dU < 2) || (iVar1 == 0x5f)) || (iVar1 == 0x7e)) {
        poVar2 = std::ostreambuf_iterator<char,_std::char_traits<char>_>::operator++(&local_10,0);
        std::ostreambuf_iterator<char,_std::char_traits<char>_>::operator*(poVar2);
        std::ostreambuf_iterator<char,_std::char_traits<char>_>::operator=(in_RSI,__c);
      }
      else {
        poVar2 = std::ostreambuf_iterator<char,_std::char_traits<char>_>::operator++(&local_10,0);
        std::ostreambuf_iterator<char,_std::char_traits<char>_>::operator*(poVar2);
        std::ostreambuf_iterator<char,_std::char_traits<char>_>::operator=(in_RSI,__c);
        poVar2 = std::ostreambuf_iterator<char,_std::char_traits<char>_>::operator++(&local_10,0);
        std::ostreambuf_iterator<char,_std::char_traits<char>_>::operator*(poVar2);
        std::ostreambuf_iterator<char,_std::char_traits<char>_>::operator=(in_RSI,__c);
        poVar2 = std::ostreambuf_iterator<char,_std::char_traits<char>_>::operator++(&local_10,0);
        std::ostreambuf_iterator<char,_std::char_traits<char>_>::operator*(poVar2);
        std::ostreambuf_iterator<char,_std::char_traits<char>_>::operator=(in_RSI,__c);
      }
    }
    else {
      poVar2 = std::ostreambuf_iterator<char,_std::char_traits<char>_>::operator++(&local_10,0);
      std::ostreambuf_iterator<char,_std::char_traits<char>_>::operator*(poVar2);
      std::ostreambuf_iterator<char,_std::char_traits<char>_>::operator=(in_RSI,__c);
    }
  }
  return;
}

Assistant:

void urlencode_impl(char const *b,char const *e,Iterator out)
{
	while(b!=e){
		char c=*b++;
		if(	('a'<=c && c<='z')
			|| ('A'<=c && c<='Z')
			|| ('0'<=c && c<='9'))
		{
			*out++ = c;
		}
		else {
			switch(c) {
				case '-':
				case '_':
				case '.':
				case '~':
					*out++ = c;
					break;
				default:
				{
					static char const hex[]="0123456789abcdef";
					unsigned char uc = c;
					*out++ = '%';
					*out++ = hex[(uc >> 4) & 0xF];
					*out++ = hex[ uc & 0xF];
					
				}
			};
		}
	};
}